

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi_uc *psVar1;
  anon_struct_96_18_0d0905d3 *paVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  undefined2 uVar6;
  stbi__uint32 sVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  stbi_uc sVar10;
  byte bVar11;
  uchar uVar12;
  int iVar13;
  stbi__uint32 sVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  stbi__jpeg *psVar20;
  long lVar21;
  uchar *puVar22;
  void *pvVar23;
  code *pcVar24;
  stbi_uc *psVar25;
  uchar *puVar26;
  bool bVar27;
  ushort *puVar28;
  long lVar29;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar30;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar31;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  stbi_uc *extraout_RDX_08;
  stbi_uc *extraout_RDX_09;
  stbi_uc *extraout_RDX_10;
  undefined1 auVar32 [8];
  uint uVar33;
  undefined1 *puVar34;
  byte *pbVar35;
  short *psVar36;
  long lVar37;
  stbi_uc *psVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  ulong uVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  stbi__uint32 sVar46;
  int iVar47;
  stbi__uint32 sVar48;
  ulong uVar49;
  int *piVar50;
  short sVar51;
  ushort *puVar52;
  int *piVar53;
  stbi__context *psVar54;
  ulong uVar55;
  bool bVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 local_528 [8];
  short data [64];
  uint local_cc;
  undefined1 auStack_c8 [8];
  stbi_uc *coutput [4];
  int local_9c;
  ulong local_98;
  uint local_88;
  ulong local_58;
  uint local_48;
  
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  psVar20 = (stbi__jpeg *)malloc(0x4888);
  psVar20->s = s;
  psVar20->idct_block_kernel = stbi__idct_simd;
  psVar20->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar20->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar20->jfif = 0;
  psVar20->app14_color_transform = -1;
  psVar20->marker = 0xff;
  sVar10 = stbi__get_marker(psVar20);
  if (sVar10 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar20);
  if (sVar10 == 0xd8) {
    psVar20 = (stbi__jpeg *)malloc(0x4888);
    psVar20->s = s;
    psVar20->idct_block_kernel = stbi__idct_simd;
    psVar20->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar20->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar2 = psVar20->img_comp;
      lVar21 = 0x46d8;
      do {
        psVar38 = psVar20->huff_dc[0].fast + lVar21 + -8;
        psVar38[0] = '\0';
        psVar38[1] = '\0';
        psVar38[2] = '\0';
        psVar38[3] = '\0';
        psVar38[4] = '\0';
        psVar38[5] = '\0';
        psVar38[6] = '\0';
        psVar38[7] = '\0';
        psVar38[8] = '\0';
        psVar38[9] = '\0';
        psVar38[10] = '\0';
        psVar38[0xb] = '\0';
        psVar38[0xc] = '\0';
        psVar38[0xd] = '\0';
        psVar38[0xe] = '\0';
        psVar38[0xf] = '\0';
        lVar21 = lVar21 + 0x60;
      } while (lVar21 != 0x4858);
      psVar20->restart_interval = 0;
      iVar13 = stbi__decode_jpeg_header(psVar20,0);
      uVar45 = extraout_EDX;
      if (iVar13 != 0) {
        bVar11 = stbi__get_marker(psVar20);
        do {
          if (bVar11 != 0xda) {
            if (bVar11 == 0xdc) {
              iVar13 = stbi__get16be(psVar20->s);
              sVar14 = stbi__get16be(psVar20->s);
              paVar31 = extraout_RDX;
              if (iVar13 == 4) {
                if (sVar14 == psVar20->s->img_y) goto LAB_00123763;
                stbi__g_failure_reason = "bad DNL height";
              }
              else {
                stbi__g_failure_reason = "bad DNL len";
              }
              goto LAB_00124a4b;
            }
            if (bVar11 == 0xd9) {
              if ((psVar20->progressive != 0) && (0 < psVar20->s->img_n)) {
                lVar21 = 0;
                do {
                  iVar13 = psVar20->img_comp[lVar21].y + 7 >> 3;
                  if (0 < iVar13) {
                    uVar45 = paVar2[lVar21].x + 7 >> 3;
                    iVar47 = 0;
                    do {
                      if (0 < (int)uVar45) {
                        uVar55 = 0;
                        do {
                          psVar36 = paVar2[lVar21].coeff +
                                    (paVar2[lVar21].coeff_w * iVar47 + (int)uVar55) * 0x40;
                          iVar43 = paVar2[lVar21].tq;
                          lVar29 = 0;
                          do {
                            psVar36[lVar29] = psVar36[lVar29] * psVar20->dequant[iVar43][lVar29];
                            lVar29 = lVar29 + 1;
                          } while (lVar29 != 0x40);
                          (*psVar20->idct_block_kernel)
                                    (paVar2[lVar21].data +
                                     uVar55 * 8 + (long)(iVar47 * 8 * paVar2[lVar21].w2),
                                     paVar2[lVar21].w2,psVar36);
                          uVar55 = uVar55 + 1;
                        } while (uVar55 != uVar45);
                      }
                      iVar47 = iVar47 + 1;
                    } while (iVar47 != iVar13);
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 < psVar20->s->img_n);
              }
              if (req_comp == 0) {
                req_comp = (uint)(2 < psVar20->s->img_n) * 2 + 1;
              }
              uVar45 = psVar20->s->img_n;
              if (uVar45 == 3) {
                bVar57 = true;
                if (psVar20->rgb != 3) {
                  if (psVar20->app14_color_transform != 0) goto LAB_001241c7;
                  bVar57 = psVar20->jfif == 0;
                }
              }
              else {
LAB_001241c7:
                bVar57 = false;
              }
              uVar15 = 1;
              if (bVar57) {
                uVar15 = uVar45;
              }
              if (2 < req_comp) {
                uVar15 = uVar45;
              }
              if (uVar45 != 3) {
                uVar15 = uVar45;
              }
              coutput[1] = (stbi_uc *)0x0;
              coutput[2] = (stbi_uc *)0x0;
              auStack_c8 = (undefined1  [8])0x0;
              coutput[0] = (stbi_uc *)0x0;
              if ((int)uVar15 < 1) {
LAB_0012434c:
                psVar54 = psVar20->s;
                sVar14 = psVar54->img_y;
                pvVar23 = stbi__malloc_mad3(req_comp,psVar54->img_x,sVar14,1);
                iVar13 = (int)extraout_RDX_08;
                if (pvVar23 != (void *)0x0) {
                  if (sVar14 != 0) {
                    coutput[3] = (stbi_uc *)((long)pvVar23 + 2);
                    iVar47 = 0;
                    uVar45 = 0;
                    auVar32 = (undefined1  [8])extraout_RDX_08;
                    do {
                      sVar14 = psVar54->img_x;
                      if (0 < (int)uVar15) {
                        piVar53 = (int *)(data + 0x10);
                        uVar55 = 0;
                        piVar50 = &psVar20->img_comp[0].y;
                        do {
                          iVar13 = piVar53[-1];
                          iVar43 = piVar53[-3];
                          iVar18 = iVar43 >> 1;
                          auVar58 = (**(code **)(piVar53 + -10))
                                              (*(stbi_uc **)(piVar50 + 10),
                                               *(undefined8 *)
                                                ((long)piVar53 +
                                                ((ulong)(iVar18 <= iVar13) << 3 | 0xffffffffffffffe0
                                                )),*(undefined8 *)
                                                    ((long)piVar53 +
                                                    ((ulong)(iVar13 < iVar18) << 3 |
                                                    0xffffffffffffffe0)),piVar53[-2]);
                          auVar32 = auVar58._8_8_;
                          coutput[uVar55 - 1] = auVar58._0_8_;
                          piVar53[-1] = iVar13 + 1;
                          if (iVar43 <= iVar13 + 1) {
                            piVar53[-1] = 0;
                            *(long *)(piVar53 + -8) = *(long *)(piVar53 + -6);
                            iVar13 = *piVar53;
                            *piVar53 = iVar13 + 1;
                            if (iVar13 + 1 < *piVar50) {
                              *(long *)(piVar53 + -6) = *(long *)(piVar53 + -6) + (long)piVar50[1];
                            }
                          }
                          uVar55 = uVar55 + 1;
                          piVar50 = piVar50 + 0x18;
                          piVar53 = piVar53 + 0xc;
                        } while (uVar15 != uVar55);
                      }
                      if (req_comp < 3) {
                        psVar54 = psVar20->s;
                        if (bVar57) {
                          if (req_comp == 1) {
                            if (psVar54->img_x != 0) {
                              uVar55 = 0;
                              do {
                                bVar11 = coutput[1][uVar55];
                                *(char *)((long)pvVar23 + uVar55 + sVar14 * iVar47) =
                                     (char)((uint)bVar11 * 2 + ((uint)bVar11 + (uint)bVar11 * 8) * 3
                                            + (uint)coutput[0][uVar55] * 0x96 +
                                              (uint)*(byte *)((long)auStack_c8 + uVar55) * 0x4d >> 8
                                           );
                                uVar55 = uVar55 + 1;
                                auVar32 = (undefined1  [8])coutput[0];
                              } while (uVar55 < psVar54->img_x);
                            }
                          }
                          else if (psVar54->img_x != 0) {
                            uVar55 = 0;
                            do {
                              bVar11 = coutput[1][uVar55];
                              *(char *)((long)pvVar23 + uVar55 * 2 + (ulong)(sVar14 * iVar47)) =
                                   (char)((uint)bVar11 * 2 + ((uint)bVar11 + (uint)bVar11 * 8) * 3 +
                                          (uint)coutput[0][uVar55] * 0x96 +
                                          (uint)*(byte *)((long)auStack_c8 + uVar55) * 0x4d >> 8);
                              *(undefined1 *)
                               ((long)pvVar23 + uVar55 * 2 + (ulong)(sVar14 * iVar47) + 1) = 0xff;
                              uVar55 = uVar55 + 1;
                              auVar32 = (undefined1  [8])coutput[0];
                            } while (uVar55 < psVar54->img_x);
                          }
                        }
                        else if (psVar54->img_n == 4) {
                          if (psVar20->app14_color_transform == 2) {
                            if (psVar54->img_x != 0) {
                              puVar34 = (undefined1 *)((long)pvVar23 + (ulong)(sVar14 * iVar47) + 1)
                              ;
                              uVar55 = 0;
                              do {
                                iVar13 = (*(byte *)((long)auStack_c8 + uVar55) ^ 0xff) *
                                         (uint)coutput[2][uVar55];
                                puVar34[-1] = (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                                *puVar34 = 0xff;
                                uVar55 = uVar55 + 1;
                                puVar34 = puVar34 + (uint)req_comp;
                                auVar32 = (undefined1  [8])coutput[2];
                              } while (uVar55 < psVar54->img_x);
                            }
                          }
                          else {
                            if (psVar20->app14_color_transform != 0) goto LAB_0012477f;
                            if (psVar54->img_x != 0) {
                              puVar34 = (undefined1 *)((long)pvVar23 + (ulong)(sVar14 * iVar47) + 1)
                              ;
                              uVar55 = 0;
                              do {
                                bVar11 = coutput[2][uVar55];
                                iVar13 = (uint)*(byte *)((long)auStack_c8 + uVar55) * (uint)bVar11;
                                iVar43 = (uint)coutput[0][uVar55] * (uint)bVar11;
                                puVar34[-1] = (char)(((uint)coutput[1][uVar55] * (uint)bVar11 +
                                                      ((uint)coutput[1][uVar55] * (uint)bVar11 +
                                                       0x80 >> 8) + 0x80 >> 8 & 0xff) * 0x1d +
                                                     (iVar43 + (iVar43 + 0x80U >> 8) + 0x80 >> 8 &
                                                     0xff) * 0x96 +
                                                     (iVar13 + (iVar13 + 0x80U >> 8) + 0x80 >> 8 &
                                                     0xff) * 0x4d >> 8);
                                *puVar34 = 0xff;
                                uVar55 = uVar55 + 1;
                                puVar34 = puVar34 + (uint)req_comp;
                                auVar32 = auStack_c8;
                              } while (uVar55 < psVar54->img_x);
                            }
                          }
                        }
                        else {
LAB_0012477f:
                          uVar33 = psVar54->img_x;
                          auVar32 = (undefined1  [8])(ulong)uVar33;
                          if (req_comp == 1) {
                            if (uVar33 != 0) {
                              auVar32 = (undefined1  [8])0x0;
                              do {
                                *(stbi_uc *)
                                 ((long)auVar32 + (long)pvVar23 + (ulong)(sVar14 * iVar47)) =
                                     *(stbi_uc *)((long)auStack_c8 + (long)auVar32);
                                auVar32 = (undefined1  [8])((long)auVar32 + 1);
                              } while ((ulong)auVar32 < (stbi_uc *)(ulong)psVar54->img_x);
                            }
                          }
                          else if (uVar33 != 0) {
                            auVar32 = (undefined1  [8])0x0;
                            do {
                              *(stbi_uc *)
                               ((long)pvVar23 + (long)auVar32 * 2 + (ulong)(sVar14 * iVar47)) =
                                   *(stbi_uc *)((long)auStack_c8 + (long)auVar32);
                              *(undefined1 *)
                               ((long)pvVar23 + (long)auVar32 * 2 + (ulong)(sVar14 * iVar47) + 1) =
                                   0xff;
                              auVar32 = (undefined1  [8])((long)auVar32 + 1);
                            } while ((ulong)auVar32 < (stbi_uc *)(ulong)psVar54->img_x);
                          }
                        }
                      }
                      else {
                        psVar38 = (stbi_uc *)((long)pvVar23 + (ulong)(uVar45 * req_comp * sVar14));
                        psVar54 = psVar20->s;
                        if (psVar54->img_n == 3) {
                          if (bVar57) {
                            if (psVar54->img_x != 0) {
                              puVar34 = (undefined1 *)((long)pvVar23 + (ulong)(sVar14 * iVar47) + 3)
                              ;
                              uVar55 = 0;
                              do {
                                puVar34[-3] = *(stbi_uc *)((long)auStack_c8 + uVar55);
                                puVar34[-2] = coutput[0][uVar55];
                                puVar34[-1] = coutput[1][uVar55];
                                *puVar34 = 0xff;
                                uVar55 = uVar55 + 1;
                                puVar34 = puVar34 + (uint)req_comp;
                                auVar32 = (undefined1  [8])coutput[1];
                              } while (uVar55 < psVar54->img_x);
                            }
                          }
                          else {
LAB_001247f1:
                            (*psVar20->YCbCr_to_RGB_kernel)
                                      (psVar38,(stbi_uc *)auStack_c8,coutput[0],coutput[1],
                                       psVar54->img_x,req_comp);
                            auVar32 = (undefined1  [8])extraout_RDX_09;
                          }
                        }
                        else if (psVar54->img_n == 4) {
                          if (psVar20->app14_color_transform == 2) {
                            (*psVar20->YCbCr_to_RGB_kernel)
                                      (psVar38,(stbi_uc *)auStack_c8,coutput[0],coutput[1],
                                       psVar54->img_x,req_comp);
                            psVar54 = psVar20->s;
                            auVar32 = (undefined1  [8])extraout_RDX_10;
                            if (psVar54->img_x != 0) {
                              pbVar35 = coutput[3] + sVar14 * iVar47;
                              auVar32 = (undefined1  [8])0x0;
                              do {
                                bVar11 = coutput[2][(long)auVar32];
                                iVar13 = (pbVar35[-2] ^ 0xff) * (uint)bVar11;
                                pbVar35[-2] = (byte)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                                iVar13 = (pbVar35[-1] ^ 0xff) * (uint)bVar11;
                                pbVar35[-1] = (byte)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                                iVar13 = (*pbVar35 ^ 0xff) * (uint)bVar11;
                                *pbVar35 = (byte)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                                auVar32 = (undefined1  [8])((long)auVar32 + 1);
                                pbVar35 = pbVar35 + (uint)req_comp;
                              } while ((ulong)auVar32 < (stbi_uc *)(ulong)psVar54->img_x);
                            }
                          }
                          else {
                            if (psVar20->app14_color_transform != 0) goto LAB_001247f1;
                            if (psVar54->img_x != 0) {
                              puVar34 = (undefined1 *)((long)pvVar23 + (ulong)(sVar14 * iVar47) + 3)
                              ;
                              uVar55 = 0;
                              do {
                                bVar11 = coutput[2][uVar55];
                                iVar13 = (uint)*(byte *)((long)auStack_c8 + uVar55) * (uint)bVar11;
                                puVar34[-3] = (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                                iVar13 = (uint)coutput[0][uVar55] * (uint)bVar11;
                                puVar34[-2] = (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                                puVar34[-1] = (char)(((uint)coutput[1][uVar55] * (uint)bVar11 + 0x80
                                                     >> 8) + (uint)coutput[1][uVar55] * (uint)bVar11
                                                     + 0x80 >> 8);
                                *puVar34 = 0xff;
                                uVar55 = uVar55 + 1;
                                puVar34 = puVar34 + (uint)req_comp;
                                auVar32 = (undefined1  [8])coutput[0];
                              } while (uVar55 < psVar54->img_x);
                            }
                          }
                        }
                        else if (psVar54->img_x != 0) {
                          puVar34 = (undefined1 *)((long)pvVar23 + (ulong)(sVar14 * iVar47) + 3);
                          psVar38 = (stbi_uc *)0x0;
                          do {
                            sVar10 = *(stbi_uc *)((long)auStack_c8 + (long)psVar38);
                            puVar34[-1] = sVar10;
                            puVar34[-2] = sVar10;
                            puVar34[-3] = sVar10;
                            *puVar34 = 0xff;
                            psVar38 = psVar38 + 1;
                            auVar32 = (undefined1  [8])(ulong)psVar54->img_x;
                            puVar34 = puVar34 + (uint)req_comp;
                          } while (psVar38 < (ulong)auVar32);
                        }
                      }
                      iVar13 = SUB84(auVar32,0);
                      uVar45 = uVar45 + 1;
                      psVar54 = psVar20->s;
                      iVar47 = iVar47 + req_comp;
                    } while (uVar45 < psVar54->img_y);
                  }
                  stbi__free_jpeg_components(psVar20,psVar54->img_n,iVar13);
                  psVar54 = psVar20->s;
                  *x = psVar54->img_x;
                  *y = psVar54->img_y;
                  if (comp != (int *)0x0) {
                    *comp = (uint)(2 < psVar54->img_n) * 2 + 1;
                  }
                  goto LAB_00124a64;
                }
                stbi__free_jpeg_components(psVar20,psVar54->img_n,iVar13);
                stbi__g_failure_reason = "outofmem";
              }
              else {
                lVar21 = 0;
                while( true ) {
                  psVar54 = psVar20->s;
                  sVar14 = psVar54->img_x;
                  pvVar23 = malloc((ulong)(sVar14 + 3));
                  *(void **)((long)&psVar20->img_comp[0].linebuf + lVar21 * 2) = pvVar23;
                  if (pvVar23 == (void *)0x0) {
                    stbi__free_jpeg_components(psVar20,psVar54->img_n,why);
                    stbi__g_failure_reason = "outofmem";
                  }
                  else {
                    uVar55 = (long)psVar20->img_h_max /
                             (long)*(int *)((long)&psVar20->img_comp[0].h + lVar21 * 2);
                    iVar13 = (int)uVar55;
                    *(int *)((long)data + lVar21 + 0x10) = iVar13;
                    iVar47 = psVar20->img_v_max /
                             *(int *)((long)&psVar20->img_comp[0].v + lVar21 * 2);
                    *(int *)((long)data + lVar21 + 0x14) = iVar47;
                    *(int *)((long)data + lVar21 + 0x1c) = iVar47 >> 1;
                    *(int *)((long)data + lVar21 + 0x18) =
                         (int)((ulong)((sVar14 + iVar13) - 1) / (uVar55 & 0xffffffff));
                    *(undefined4 *)((long)data + lVar21 + 0x20) = 0;
                    uVar8 = *(undefined8 *)((long)&psVar20->img_comp[0].data + lVar21 * 2);
                    *(undefined8 *)((long)data + lVar21 + 8) = uVar8;
                    *(undefined8 *)((long)data + lVar21) = uVar8;
                    if ((iVar13 == 1) && (iVar47 == 1)) {
                      *(code **)((long)data + lVar21 + -8) = resample_row_1;
                    }
                    else {
                      if ((iVar13 == 1) && (iVar47 == 2)) {
                        pcVar24 = stbi__resample_row_v_2;
                      }
                      else if ((iVar13 == 2) && (iVar47 == 1)) {
                        pcVar24 = stbi__resample_row_h_2;
                      }
                      else if ((iVar13 == 2) && (iVar47 == 2)) {
                        pcVar24 = psVar20->resample_row_hv_2_kernel;
                      }
                      else {
                        pcVar24 = stbi__resample_row_generic;
                      }
                      *(code **)((long)data + lVar21 + -8) = pcVar24;
                    }
                  }
                  if (pvVar23 == (void *)0x0) break;
                  lVar21 = lVar21 + 0x30;
                  if ((ulong)uVar15 * 0x30 == lVar21) goto LAB_0012434c;
                }
              }
              goto LAB_00124a61;
            }
            iVar13 = stbi__process_marker(psVar20,(uint)bVar11);
            uVar45 = extraout_EDX_00;
            if (iVar13 != 0) goto LAB_00123763;
            break;
          }
          iVar13 = stbi__get16be(psVar20->s);
          psVar54 = psVar20->s;
          pbVar35 = psVar54->img_buffer;
          paVar31 = extraout_RDX_00;
          if (pbVar35 < psVar54->img_buffer_end) {
LAB_001223ae:
            psVar54->img_buffer = pbVar35 + 1;
            bVar11 = *pbVar35;
          }
          else {
            if (psVar54->read_from_callbacks != 0) {
              psVar38 = psVar54->buffer_start;
              iVar47 = (*(psVar54->io).read)(psVar54->io_user_data,(char *)psVar38,psVar54->buflen);
              if (iVar47 == 0) {
                psVar54->read_from_callbacks = 0;
                psVar54->img_buffer = psVar38;
                psVar54->img_buffer_end = psVar54->buffer_start + 1;
                psVar54->buffer_start[0] = '\0';
              }
              else {
                psVar54->img_buffer = psVar38;
                psVar54->img_buffer_end = psVar38 + iVar47;
              }
              pbVar35 = psVar54->img_buffer;
              paVar31 = extraout_RDX_01;
              goto LAB_001223ae;
            }
            bVar11 = 0;
          }
          psVar20->scan_n = (uint)bVar11;
          if (((byte)(bVar11 - 5) < 0xfc) || (psVar20->s->img_n < (int)(uint)bVar11)) {
            stbi__g_failure_reason = "bad SOS component count";
LAB_00124a4b:
            uVar45 = (uint)paVar31;
            break;
          }
          if (iVar13 != (uint)bVar11 * 2 + 6) {
            stbi__g_failure_reason = "bad SOS len";
            goto LAB_00124a4b;
          }
          if (bVar11 != 0) {
            lVar21 = 0;
            do {
              psVar54 = psVar20->s;
              pbVar35 = psVar54->img_buffer;
              if (pbVar35 < psVar54->img_buffer_end) {
LAB_0012246a:
                psVar54->img_buffer = pbVar35 + 1;
                uVar15 = (uint)*pbVar35;
              }
              else {
                if (psVar54->read_from_callbacks != 0) {
                  psVar38 = psVar54->buffer_start;
                  iVar13 = (*(psVar54->io).read)
                                     (psVar54->io_user_data,(char *)psVar38,psVar54->buflen);
                  if (iVar13 == 0) {
                    psVar54->read_from_callbacks = 0;
                    psVar54->img_buffer = psVar38;
                    psVar54->img_buffer_end = psVar54->buffer_start + 1;
                    psVar54->buffer_start[0] = '\0';
                  }
                  else {
                    psVar54->img_buffer = psVar38;
                    psVar54->img_buffer_end = psVar38 + iVar13;
                  }
                  pbVar35 = psVar54->img_buffer;
                  goto LAB_0012246a;
                }
                uVar15 = 0;
              }
              psVar54 = psVar20->s;
              pbVar35 = psVar54->img_buffer;
              if (pbVar35 < psVar54->img_buffer_end) {
LAB_001224f9:
                psVar54->img_buffer = pbVar35 + 1;
                bVar11 = *pbVar35;
              }
              else {
                if (psVar54->read_from_callbacks != 0) {
                  psVar38 = psVar54->buffer_start;
                  iVar13 = (*(psVar54->io).read)
                                     (psVar54->io_user_data,(char *)psVar38,psVar54->buflen);
                  if (iVar13 == 0) {
                    psVar54->read_from_callbacks = 0;
                    psVar54->img_buffer = psVar38;
                    psVar54->img_buffer_end = psVar54->buffer_start + 1;
                    psVar54->buffer_start[0] = '\0';
                  }
                  else {
                    psVar54->img_buffer = psVar38;
                    psVar54->img_buffer_end = psVar38 + iVar13;
                  }
                  pbVar35 = psVar54->img_buffer;
                  goto LAB_001224f9;
                }
                bVar11 = 0;
              }
              uVar45 = psVar20->s->img_n;
              if ((int)uVar45 < 1) {
                uVar55 = 0;
              }
              else {
                uVar55 = 0;
                paVar31 = paVar2;
                do {
                  if (paVar31->id == uVar15) goto LAB_00122532;
                  uVar55 = uVar55 + 1;
                  paVar31 = paVar31 + 1;
                } while (uVar45 != uVar55);
                uVar55 = (ulong)uVar45;
              }
LAB_00122532:
              if ((uint)uVar55 == uVar45) goto LAB_00124a52;
              uVar39 = uVar55 & 0xffffffff;
              paVar31 = (anon_struct_96_18_0d0905d3 *)(uVar39 * 0x60);
              psVar20->img_comp[uVar39].hd = (uint)(bVar11 >> 4);
              if (0x3f < bVar11) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_00124a4b;
              }
              paVar31 = paVar2 + uVar39;
              paVar31->ha = bVar11 & 0xf;
              if (3 < (bVar11 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_00124a4b;
              }
              psVar20->order[lVar21] = (uint)uVar55;
              lVar21 = lVar21 + 1;
            } while (lVar21 < psVar20->scan_n);
          }
          psVar54 = psVar20->s;
          pbVar35 = psVar54->img_buffer;
          if (pbVar35 < psVar54->img_buffer_end) {
LAB_001225f8:
            psVar54->img_buffer = pbVar35 + 1;
            uVar45 = (uint)*pbVar35;
          }
          else {
            if (psVar54->read_from_callbacks != 0) {
              psVar38 = psVar54->buffer_start;
              iVar13 = (*(psVar54->io).read)(psVar54->io_user_data,(char *)psVar38,psVar54->buflen);
              if (iVar13 == 0) {
                psVar54->read_from_callbacks = 0;
                psVar54->img_buffer = psVar38;
                psVar54->img_buffer_end = psVar54->buffer_start + 1;
                psVar54->buffer_start[0] = '\0';
              }
              else {
                psVar54->img_buffer = psVar38;
                psVar54->img_buffer_end = psVar38 + iVar13;
              }
              pbVar35 = psVar54->img_buffer;
              goto LAB_001225f8;
            }
            uVar45 = 0;
          }
          psVar20->spec_start = uVar45;
          psVar54 = psVar20->s;
          pbVar35 = psVar54->img_buffer;
          if (pbVar35 < psVar54->img_buffer_end) {
LAB_0012267e:
            psVar54->img_buffer = pbVar35 + 1;
            uVar45 = (uint)*pbVar35;
          }
          else {
            if (psVar54->read_from_callbacks != 0) {
              psVar38 = psVar54->buffer_start;
              iVar13 = (*(psVar54->io).read)(psVar54->io_user_data,(char *)psVar38,psVar54->buflen);
              if (iVar13 == 0) {
                psVar54->read_from_callbacks = 0;
                psVar54->img_buffer = psVar38;
                psVar54->img_buffer_end = psVar54->buffer_start + 1;
                psVar54->buffer_start[0] = '\0';
              }
              else {
                psVar54->img_buffer = psVar38;
                psVar54->img_buffer_end = psVar38 + iVar13;
              }
              pbVar35 = psVar54->img_buffer;
              goto LAB_0012267e;
            }
            uVar45 = 0;
          }
          psVar20->spec_end = uVar45;
          psVar54 = psVar20->s;
          pbVar35 = psVar54->img_buffer;
          if (pbVar35 < psVar54->img_buffer_end) {
LAB_00122704:
            psVar54->img_buffer = pbVar35 + 1;
            bVar11 = *pbVar35;
          }
          else {
            if (psVar54->read_from_callbacks != 0) {
              psVar38 = psVar54->buffer_start;
              iVar13 = (*(psVar54->io).read)(psVar54->io_user_data,(char *)psVar38,psVar54->buflen);
              if (iVar13 == 0) {
                psVar54->read_from_callbacks = 0;
                psVar54->img_buffer = psVar38;
                psVar54->img_buffer_end = psVar54->buffer_start + 1;
                psVar54->buffer_start[0] = '\0';
              }
              else {
                psVar54->img_buffer = psVar38;
                psVar54->img_buffer_end = psVar38 + iVar13;
              }
              pbVar35 = psVar54->img_buffer;
              goto LAB_00122704;
            }
            bVar11 = 0;
          }
          psVar20->succ_high = (uint)(bVar11 >> 4);
          uVar45 = bVar11 & 0xf;
          paVar31 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar45;
          psVar20->succ_low = uVar45;
          iVar13 = psVar20->progressive;
          iVar47 = psVar20->spec_start;
          if (iVar13 == 0) {
            if (((iVar47 != 0) || (0xf < bVar11)) || ((bVar11 & 0xf) != 0)) goto LAB_00123f8d;
            psVar20->spec_end = 0x3f;
          }
          else if (((0x3f < iVar47) || (0x3f < psVar20->spec_end)) ||
                  ((psVar20->spec_end < iVar47 || ((0xdf < bVar11 || (0xd < uVar45)))))) {
LAB_00123f8d:
            stbi__g_failure_reason = "bad SOS";
            goto LAB_00124a4b;
          }
          iVar47 = psVar20->scan_n;
          uVar55 = (ulong)(uint)psVar20->restart_interval;
          if (psVar20->restart_interval == 0) {
            uVar55 = 0x7fffffff;
          }
          psVar20->code_buffer = 0;
          psVar20->code_bits = 0;
          psVar20->nomore = 0;
          psVar20->img_comp[3].dc_pred = 0;
          psVar20->img_comp[2].dc_pred = 0;
          psVar20->img_comp[1].dc_pred = 0;
          psVar20->img_comp[0].dc_pred = 0;
          psVar20->marker = 0xff;
          uVar45 = (uint)uVar55;
          psVar20->todo = uVar45;
          psVar20->eob_run = 0;
          if (iVar13 == 0) {
            if (iVar47 == 1) {
              iVar13 = psVar20->order[0];
              uVar15 = psVar20->img_comp[iVar13].y + 7 >> 3;
              local_98 = (ulong)uVar15;
              if (0 < (int)uVar15) {
                uVar33 = paVar2[iVar13].x + 7 >> 3;
                iVar47 = 0;
                uVar44 = 0;
                do {
                  if (0 < (int)uVar33) {
                    lVar21 = 0;
                    do {
                      iVar43 = stbi__jpeg_decode_block
                                         (psVar20,(short *)local_528,
                                          (stbi__huffman *)psVar20->huff_dc[paVar2[iVar13].hd].fast,
                                          (stbi__huffman *)psVar20->huff_ac[paVar2[iVar13].ha].fast,
                                          psVar20->fast_ac[paVar2[iVar13].ha],iVar13,
                                          psVar20->dequant[paVar2[iVar13].tq]);
                      if (iVar43 == 0) {
                        bVar57 = false;
                        local_58 = 0;
                        uVar55 = extraout_RDX_02;
                      }
                      else {
                        (*psVar20->idct_block_kernel)
                                  (paVar2[iVar13].data + lVar21 + iVar47 * paVar2[iVar13].w2,
                                   paVar2[iVar13].w2,(short *)local_528);
                        iVar43 = psVar20->todo;
                        psVar20->todo = iVar43 + -1;
                        bVar57 = true;
                        uVar55 = extraout_RDX_03;
                        if (iVar43 < 2) {
                          if (psVar20->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar20);
                            uVar55 = extraout_RDX_04;
                          }
                          if ((psVar20->marker & 0xf8) == 0xd0) {
                            psVar20->code_buffer = 0;
                            psVar20->code_bits = 0;
                            psVar20->nomore = 0;
                            psVar20->img_comp[3].dc_pred = 0;
                            psVar20->img_comp[2].dc_pred = 0;
                            psVar20->img_comp[1].dc_pred = 0;
                            psVar20->img_comp[0].dc_pred = 0;
                            psVar20->marker = 0xff;
                            iVar43 = psVar20->restart_interval;
                            uVar55 = 0x7fffffff;
                            if (iVar43 == 0) {
                              iVar43 = 0x7fffffff;
                            }
                            psVar20->todo = iVar43;
                            psVar20->eob_run = 0;
                          }
                          else {
                            local_58 = 1;
                            bVar57 = false;
                          }
                        }
                      }
                      uVar45 = (uint)uVar55;
                      if (!bVar57) {
                        iVar13 = (int)local_58;
                        goto LAB_00123750;
                      }
                      lVar21 = lVar21 + 8;
                    } while ((ulong)uVar33 * 8 != lVar21);
                  }
                  uVar45 = (uint)uVar55;
                  uVar44 = uVar44 + 1;
                  iVar47 = iVar47 + 8;
                } while (uVar44 != uVar15);
              }
              iVar13 = 1;
            }
            else {
              iVar13 = 1;
              if (0 < psVar20->img_mcu_y) {
                iVar47 = 0;
                do {
                  if (0 < psVar20->img_mcu_x) {
                    iVar43 = 0;
                    do {
                      if (0 < psVar20->scan_n) {
                        psVar38 = (stbi_uc *)0x0;
                        do {
                          iVar13 = psVar20->order[(long)psVar38];
                          local_58 = (ulong)iVar13;
                          coutput[3] = psVar38;
                          if (0 < psVar20->img_comp[local_58].v) {
                            iVar18 = 0;
                            bVar57 = true;
                            do {
                              local_98 = CONCAT71(local_98._1_7_,bVar57);
                              iVar40 = paVar2[local_58].h;
                              if (0 < iVar40) {
                                iVar41 = 0;
                                do {
                                  iVar19 = paVar2[local_58].v;
                                  iVar17 = stbi__jpeg_decode_block
                                                     (psVar20,(short *)local_528,
                                                      (stbi__huffman *)
                                                      psVar20->huff_dc[paVar2[local_58].hd].fast,
                                                      (stbi__huffman *)
                                                      psVar20->huff_ac[paVar2[local_58].ha].fast,
                                                      psVar20->fast_ac[paVar2[local_58].ha],iVar13,
                                                      psVar20->dequant[paVar2[local_58].tq]);
                                  uVar45 = (uint)extraout_RDX_06;
                                  if (iVar17 == 0) {
                                    uVar55 = extraout_RDX_06;
                                    if (bVar57 == false) goto LAB_0012364c;
                                    goto LAB_00123736;
                                  }
                                  (*psVar20->idct_block_kernel)
                                            (paVar2[local_58].data +
                                             (long)((iVar40 * iVar43 + iVar41) * 8) +
                                             (long)((iVar19 * iVar47 + iVar18) * paVar2[local_58].w2
                                                   * 8),paVar2[local_58].w2,(short *)local_528);
                                  iVar41 = iVar41 + 1;
                                  iVar40 = paVar2[local_58].h;
                                  uVar55 = extraout_RDX_07;
                                } while (iVar41 < iVar40);
                              }
                              iVar18 = iVar18 + 1;
                              bVar57 = iVar18 < paVar2[local_58].v;
                            } while (iVar18 < paVar2[local_58].v);
                          }
LAB_0012364c:
                          psVar38 = coutput[3] + 1;
                        } while ((long)psVar38 < (long)psVar20->scan_n);
                      }
                      uVar45 = (uint)uVar55;
                      iVar18 = psVar20->todo;
                      psVar20->todo = iVar18 + -1;
                      iVar13 = 1;
                      if (iVar18 < 2) {
                        if (psVar20->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar20);
                          uVar45 = extraout_EDX_02;
                        }
                        if ((psVar20->marker & 0xf8) != 0xd0) goto LAB_00123750;
                        psVar20->code_buffer = 0;
                        psVar20->code_bits = 0;
                        psVar20->nomore = 0;
                        psVar20->img_comp[3].dc_pred = 0;
                        psVar20->img_comp[2].dc_pred = 0;
                        psVar20->img_comp[1].dc_pred = 0;
                        psVar20->img_comp[0].dc_pred = 0;
                        psVar20->marker = 0xff;
                        iVar13 = psVar20->restart_interval;
                        uVar55 = 0x7fffffff;
                        if (iVar13 == 0) {
                          iVar13 = 0x7fffffff;
                        }
                        psVar20->todo = iVar13;
                        psVar20->eob_run = 0;
                      }
                      iVar43 = iVar43 + 1;
                    } while (iVar43 < psVar20->img_mcu_x);
                  }
                  uVar45 = (uint)uVar55;
                  iVar13 = 1;
                  iVar47 = iVar47 + 1;
                } while (iVar47 < psVar20->img_mcu_y);
              }
            }
          }
          else if (iVar47 == 1) {
            iVar47 = psVar20->order[0];
            iVar43 = psVar20->img_comp[iVar47].y + 7 >> 3;
            iVar13 = 1;
            if (0 < iVar43) {
              uVar15 = psVar20->img_comp[iVar47].x + 7 >> 3;
              coutput[3] = (stbi_uc *)((ulong)coutput[3] & 0xffffffff00000000);
              do {
                if (0 < (int)uVar15) {
                  uVar55 = 0;
                  do {
                    uVar45 = (uint)uVar55;
                    psVar36 = paVar2[iVar47].coeff +
                              (int)((paVar2[iVar47].coeff_w * (int)coutput[3] + uVar45) * 0x40);
                    uVar55 = (ulong)psVar20->spec_start;
                    if (uVar55 == 0) {
                      iVar13 = stbi__jpeg_decode_block_prog_dc
                                         (psVar20,psVar36,
                                          (stbi__huffman *)psVar20->huff_dc[paVar2[iVar47].hd].fast,
                                          iVar47);
                      if (iVar13 != 0) goto LAB_00122d23;
                      bVar57 = false;
                      local_98 = 0;
                    }
                    else {
                      iVar13 = paVar2[iVar47].ha;
                      local_58 = (ulong)(uint)psVar20->succ_low;
                      iVar18 = psVar20->eob_run;
                      bVar11 = (byte)psVar20->succ_low;
                      if (psVar20->succ_high == 0) {
                        if (iVar18 == 0) {
                          do {
                            if (psVar20->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(psVar20);
                            }
                            sVar51 = psVar20->fast_ac[iVar13][psVar20->code_buffer >> 0x17];
                            uVar33 = (uint)sVar51;
                            iVar18 = (int)uVar55;
                            if (sVar51 == 0) {
                              if (psVar20->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar20);
                              }
                              uVar33 = psVar20->code_buffer;
                              uVar39 = (ulong)psVar20->huff_ac[iVar13].fast[uVar33 >> 0x17];
                              if (uVar39 == 0xff) {
                                lVar21 = 0;
                                do {
                                  lVar29 = lVar21;
                                  lVar21 = lVar29 + 1;
                                } while (psVar20->huff_ac[iVar13].maxcode[lVar29 + 10] <=
                                         uVar33 >> 0x10);
                                iVar40 = psVar20->code_bits;
                                if (lVar21 == 8) {
                                  psVar20->code_bits = iVar40 + -0x10;
                                  uVar42 = 0xffffffff;
                                }
                                else {
                                  uVar42 = 0xffffffff;
                                  if ((int)(lVar29 + 10) <= iVar40) {
                                    iVar41 = (uVar33 >> (0x17U - (char)lVar21 & 0x1f) &
                                             stbi__bmask[lVar29 + 10]) +
                                             psVar20->huff_ac[iVar13].delta[lVar29 + 10];
                                    bVar3 = psVar20->huff_ac[iVar13].size[iVar41];
                                    if ((uVar33 >> (-bVar3 & 0x1f) & stbi__bmask[bVar3]) !=
                                        (uint)psVar20->huff_ac[iVar13].code[iVar41])
                                    goto LAB_00125a0c;
                                    psVar20->code_bits = (iVar40 - (int)lVar21) + -9;
                                    psVar20->code_buffer = uVar33 << ((byte)(lVar29 + 10) & 0x1f);
                                    uVar42 = (ulong)psVar20->huff_ac[iVar13].values[iVar41];
                                  }
                                }
                              }
                              else {
                                bVar3 = psVar20->huff_ac[iVar13].size[uVar39];
                                uVar42 = 0xffffffff;
                                if ((int)(uint)bVar3 <= psVar20->code_bits) {
                                  psVar20->code_buffer = uVar33 << (bVar3 & 0x1f);
                                  psVar20->code_bits = psVar20->code_bits - (uint)bVar3;
                                  uVar42 = (ulong)psVar20->huff_ac[iVar13].values[uVar39];
                                }
                              }
                              uVar33 = (uint)uVar42;
                              if ((int)uVar33 < 0) {
                                stbi__g_failure_reason = "bad huffman code";
                                iVar18 = 1;
                                bVar57 = false;
                              }
                              else {
                                uVar39 = uVar42 >> 4;
                                uVar44 = uVar33 & 0xf;
                                if ((uVar42 & 0xf) == 0) {
                                  if (uVar33 < 0xf0) {
                                    psVar20->eob_run = 1 << ((byte)uVar39 & 0x1f);
                                    if (0xf < uVar33) {
                                      if (psVar20->code_bits < (int)uVar39) {
                                        stbi__grow_buffer_unsafe(psVar20);
                                      }
                                      bVar3 = (byte)uVar39 & 0x1f;
                                      uVar44 = psVar20->code_buffer << bVar3 |
                                               psVar20->code_buffer >> 0x20 - bVar3;
                                      uVar33 = stbi__bmask[uVar39];
                                      psVar20->code_buffer = ~uVar33 & uVar44;
                                      psVar20->code_bits = psVar20->code_bits - (int)uVar39;
                                      psVar20->eob_run = psVar20->eob_run + (uVar44 & uVar33);
                                    }
                                    psVar20->eob_run = psVar20->eob_run + -1;
                                    iVar18 = 2;
                                    bVar57 = false;
                                    goto LAB_00123115;
                                  }
                                  uVar33 = iVar18 + 0x10;
                                }
                                else {
                                  bVar3 = ""[(long)iVar18 + uVar39];
                                  if (psVar20->code_bits < (int)uVar44) {
                                    stbi__grow_buffer_unsafe(psVar20);
                                  }
                                  uVar33 = psVar20->code_buffer;
                                  uVar30 = uVar33 << (sbyte)uVar44 | uVar33 >> 0x20 - (sbyte)uVar44;
                                  uVar16 = *(uint *)((long)stbi__bmask + (ulong)(uVar44 * 4));
                                  psVar20->code_buffer = ~uVar16 & uVar30;
                                  psVar20->code_bits = psVar20->code_bits - uVar44;
                                  iVar40 = 0;
                                  if (-1 < (int)uVar33) {
                                    iVar40 = *(int *)((long)stbi__jbias + (ulong)(uVar44 * 4));
                                  }
                                  uVar33 = (int)((long)iVar18 + uVar39) + 1;
                                  psVar36[bVar3] =
                                       (short)((uVar30 & uVar16) + iVar40 << (bVar11 & 0x1f));
                                }
                                iVar18 = 0;
                                uVar55 = (ulong)uVar33;
                                bVar57 = true;
                              }
                            }
                            else {
                              psVar20->code_buffer = psVar20->code_buffer << (sbyte)(uVar33 & 0xf);
                              psVar20->code_bits = psVar20->code_bits - (uVar33 & 0xf);
                              lVar21 = (long)iVar18 + (ulong)(uVar33 >> 4 & 0xf);
                              uVar55 = (ulong)((int)lVar21 + 1);
                              psVar36[""[lVar21]] = (short)((uVar33 >> 8) << (bVar11 & 0x1f));
                              iVar18 = 0 << (bVar11 & 0x1f);
                              bVar57 = true;
                            }
LAB_00123115:
                            bVar27 = false;
                            bVar56 = true;
                            if (iVar18 != 0) {
                              bVar27 = false;
                              if (iVar18 != 2) {
                                bVar56 = bVar57;
                                bVar27 = false;
                              }
                              break;
                            }
                          } while ((int)uVar55 <= psVar20->spec_end);
                        }
                        else {
                          psVar20->eob_run = iVar18 + -1;
                          bVar56 = false;
                          bVar27 = true;
                        }
                        if (bVar56) goto LAB_00122cfd;
                      }
                      else {
                        if (iVar18 == 0) {
                          uVar33 = (0x10000 << (bVar11 & 0x1f)) >> 0x10;
                          do {
                            if (psVar20->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(psVar20);
                            }
                            uVar44 = psVar20->code_buffer;
                            uVar39 = (ulong)psVar20->huff_ac[iVar13].fast[uVar44 >> 0x17];
                            if (uVar39 == 0xff) {
                              lVar21 = 0;
                              do {
                                lVar29 = lVar21;
                                lVar21 = lVar29 + 1;
                              } while (psVar20->huff_ac[iVar13].maxcode[lVar29 + 10] <=
                                       uVar44 >> 0x10);
                              iVar18 = psVar20->code_bits;
                              if (lVar21 == 8) {
                                psVar20->code_bits = iVar18 + -0x10;
                                uVar42 = 0xffffffff;
                              }
                              else {
                                uVar42 = 0xffffffff;
                                if ((int)(lVar29 + 10) <= iVar18) {
                                  iVar40 = (uVar44 >> (0x17U - (char)lVar21 & 0x1f) &
                                           stbi__bmask[lVar29 + 10]) +
                                           psVar20->huff_ac[iVar13].delta[lVar29 + 10];
                                  bVar3 = psVar20->huff_ac[iVar13].size[iVar40];
                                  if ((uVar44 >> (-bVar3 & 0x1f) & stbi__bmask[bVar3]) !=
                                      (uint)psVar20->huff_ac[iVar13].code[iVar40]) {
LAB_00125a0c:
                                    __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                                                  ,0x7a1,
                                                  "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                                 );
                                  }
                                  psVar20->code_bits = (iVar18 - (int)lVar21) + -9;
                                  psVar20->code_buffer = uVar44 << ((byte)(lVar29 + 10) & 0x1f);
                                  uVar42 = (ulong)psVar20->huff_ac[iVar13].values[iVar40];
                                }
                              }
                            }
                            else {
                              bVar3 = psVar20->huff_ac[iVar13].size[uVar39];
                              uVar42 = 0xffffffff;
                              if ((int)(uint)bVar3 <= psVar20->code_bits) {
                                psVar20->code_buffer = uVar44 << (bVar3 & 0x1f);
                                psVar20->code_bits = psVar20->code_bits - (uint)bVar3;
                                uVar42 = (ulong)psVar20->huff_ac[iVar13].values[uVar39];
                              }
                            }
                            uVar44 = (uint)uVar42;
                            if ((int)uVar44 < 0) {
LAB_00122bd7:
                              stbi__g_failure_reason = "bad huffman code";
                              bVar57 = false;
                            }
                            else {
                              uVar39 = uVar42 >> 4;
                              if ((uVar44 & 0xf) == 1) {
                                if (psVar20->code_bits < 1) {
                                  stbi__grow_buffer_unsafe(psVar20);
                                }
                                uVar44 = psVar20->code_buffer;
                                psVar20->code_buffer = uVar44 * 2;
                                psVar20->code_bits = psVar20->code_bits + -1;
                                sVar51 = (short)(((int)~uVar44 >> 0x1f | 1U) << (bVar11 & 0x1f));
                              }
                              else {
                                if ((uVar42 & 0xf) != 0) goto LAB_00122bd7;
                                if (uVar44 < 0xf0) {
                                  psVar20->eob_run = ~(-1 << ((byte)uVar39 & 0x1f));
                                  uVar42 = 0x40;
                                  if (0xf < uVar44) {
                                    if (psVar20->code_bits < (int)uVar39) {
                                      stbi__grow_buffer_unsafe(psVar20);
                                    }
                                    bVar3 = (byte)uVar39 & 0x1f;
                                    uVar16 = psVar20->code_buffer << bVar3 |
                                             psVar20->code_buffer >> 0x20 - bVar3;
                                    uVar44 = stbi__bmask[uVar39];
                                    psVar20->code_buffer = ~uVar44 & uVar16;
                                    psVar20->code_bits = psVar20->code_bits - (int)uVar39;
                                    psVar20->eob_run = psVar20->eob_run + (uVar16 & uVar44);
                                  }
                                }
                                else {
                                  uVar42 = 0xf;
                                }
                                sVar51 = 0;
                                uVar39 = uVar42;
                              }
                              uVar55 = (ulong)(int)uVar55;
                              do {
                                if ((long)psVar20->spec_end < (long)uVar55) break;
                                bVar3 = ""[uVar55];
                                if (psVar36[bVar3] == 0) {
                                  if ((int)uVar39 == 0) {
                                    psVar36[bVar3] = sVar51;
                                    bVar57 = false;
                                    uVar39 = 0;
                                  }
                                  else {
                                    uVar39 = (ulong)((int)uVar39 - 1);
                                    bVar57 = true;
                                  }
                                }
                                else {
                                  if (psVar20->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar20);
                                  }
                                  sVar14 = psVar20->code_buffer;
                                  psVar20->code_buffer = sVar14 * 2;
                                  psVar20->code_bits = psVar20->code_bits + -1;
                                  bVar57 = true;
                                  if (((int)sVar14 < 0) &&
                                     (sVar4 = psVar36[bVar3], (uVar33 & (int)sVar4) == 0)) {
                                    uVar44 = uVar33;
                                    if (sVar4 < 1) {
                                      uVar44 = -uVar33;
                                    }
                                    psVar36[bVar3] = sVar4 + (short)uVar44;
                                  }
                                }
                                uVar55 = uVar55 + 1;
                              } while (bVar57);
                              bVar57 = true;
                            }
                            if (!bVar57) {
                              bVar27 = false;
                              goto LAB_00122d02;
                            }
                          } while ((int)uVar55 <= psVar20->spec_end);
                        }
                        else {
                          psVar20->eob_run = iVar18 + -1;
                          if (psVar20->spec_start <= psVar20->spec_end) {
                            uVar33 = (0x10000 << (bVar11 & 0x1f)) >> 0x10;
                            do {
                              bVar11 = ""[uVar55];
                              if (psVar36[bVar11] != 0) {
                                if (psVar20->code_bits < 1) {
                                  stbi__grow_buffer_unsafe(psVar20);
                                }
                                sVar14 = psVar20->code_buffer;
                                psVar20->code_buffer = sVar14 * 2;
                                psVar20->code_bits = psVar20->code_bits + -1;
                                if (((int)sVar14 < 0) &&
                                   (sVar51 = psVar36[bVar11], (uVar33 & (int)sVar51) == 0)) {
                                  uVar44 = -uVar33;
                                  if (0 < sVar51) {
                                    uVar44 = uVar33;
                                  }
                                  psVar36[bVar11] = (short)uVar44 + sVar51;
                                }
                              }
                              bVar57 = (long)uVar55 < (long)psVar20->spec_end;
                              uVar55 = uVar55 + 1;
                            } while (bVar57);
                          }
                        }
LAB_00122cfd:
                        bVar27 = true;
                      }
LAB_00122d02:
                      if (!bVar27) {
                        local_98._0_4_ = 0;
                      }
                      local_98 = (ulong)(uint)local_98;
                      if (!bVar27) {
                        bVar57 = false;
                      }
                      else {
LAB_00122d23:
                        iVar13 = psVar20->todo;
                        psVar20->todo = iVar13 + -1;
                        bVar57 = true;
                        if (iVar13 < 2) {
                          if (psVar20->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar20);
                          }
                          if ((psVar20->marker & 0xf8) == 0xd0) {
                            psVar20->code_buffer = 0;
                            psVar20->code_bits = 0;
                            psVar20->nomore = 0;
                            psVar20->img_comp[3].dc_pred = 0;
                            psVar20->img_comp[2].dc_pred = 0;
                            psVar20->img_comp[1].dc_pred = 0;
                            psVar20->img_comp[0].dc_pred = 0;
                            psVar20->marker = 0xff;
                            iVar13 = psVar20->restart_interval;
                            if (iVar13 == 0) {
                              iVar13 = 0x7fffffff;
                            }
                            psVar20->todo = iVar13;
                            psVar20->eob_run = 0;
                          }
                          else {
                            local_98 = 1;
                            bVar57 = false;
                          }
                        }
                      }
                    }
                    if (!bVar57) {
                      iVar13 = (uint)local_98;
                      goto LAB_00123750;
                    }
                    uVar55 = (ulong)(uVar45 + 1);
                  } while (uVar45 + 1 != uVar15);
                }
                uVar45 = (uint)uVar55;
                iVar13 = 1;
                iVar18 = (int)coutput[3] + 1;
                coutput[3] = (stbi_uc *)CONCAT44(coutput[3]._4_4_,iVar18);
              } while (iVar18 != iVar43);
            }
          }
          else {
            iVar13 = 1;
            if (0 < psVar20->img_mcu_y) {
              iVar47 = 0;
              do {
                if (0 < psVar20->img_mcu_x) {
                  iVar43 = 0;
                  do {
                    if (0 < psVar20->scan_n) {
                      uVar39 = 0;
                      do {
                        local_58 = uVar39;
                        iVar13 = psVar20->order[local_58];
                        if (0 < psVar20->img_comp[iVar13].v) {
                          iVar18 = 0;
                          bVar57 = true;
LAB_0012338f:
                          iVar40 = paVar2[iVar13].h;
                          if (iVar40 < 1) goto LAB_001233ed;
                          iVar41 = 0;
                          while( true ) {
                            iVar40 = stbi__jpeg_decode_block_prog_dc
                                               (psVar20,paVar2[iVar13].coeff +
                                                        (iVar40 * iVar43 + iVar41 +
                                                        (paVar2[iVar13].v * iVar47 + iVar18) *
                                                        paVar2[iVar13].coeff_w) * 0x40,
                                                (stbi__huffman *)
                                                psVar20->huff_dc[paVar2[iVar13].hd].fast,iVar13);
                            uVar45 = (uint)extraout_RDX_05;
                            uVar55 = extraout_RDX_05;
                            if (iVar40 == 0) break;
                            iVar41 = iVar41 + 1;
                            iVar40 = paVar2[iVar13].h;
                            if (iVar40 <= iVar41) goto LAB_001233ed;
                          }
                          if (!bVar57) goto LAB_00123405;
LAB_00123736:
                          iVar13 = 0;
                          goto LAB_00123750;
                        }
LAB_00123405:
                        uVar39 = local_58 + 1;
                      } while ((long)(local_58 + 1) < (long)psVar20->scan_n);
                    }
                    uVar45 = (uint)uVar55;
                    iVar18 = psVar20->todo;
                    psVar20->todo = iVar18 + -1;
                    iVar13 = 1;
                    if (iVar18 < 2) {
                      if (psVar20->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar20);
                        uVar45 = extraout_EDX_01;
                      }
                      if ((psVar20->marker & 0xf8) != 0xd0) goto LAB_00123750;
                      psVar20->code_buffer = 0;
                      psVar20->code_bits = 0;
                      psVar20->nomore = 0;
                      psVar20->img_comp[3].dc_pred = 0;
                      psVar20->img_comp[2].dc_pred = 0;
                      psVar20->img_comp[1].dc_pred = 0;
                      psVar20->img_comp[0].dc_pred = 0;
                      psVar20->marker = 0xff;
                      iVar13 = psVar20->restart_interval;
                      uVar55 = 0x7fffffff;
                      if (iVar13 == 0) {
                        iVar13 = 0x7fffffff;
                      }
                      psVar20->todo = iVar13;
                      psVar20->eob_run = 0;
                    }
                    iVar43 = iVar43 + 1;
                  } while (iVar43 < psVar20->img_mcu_x);
                }
                uVar45 = (uint)uVar55;
                iVar13 = 1;
                iVar47 = iVar47 + 1;
              } while (iVar47 < psVar20->img_mcu_y);
            }
          }
LAB_00123750:
          if (iVar13 == 0) break;
          if (psVar20->marker != 0xff) goto LAB_00123763;
LAB_00123770:
          do {
            psVar54 = psVar20->s;
            if ((psVar54->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0012378c:
              if (psVar54->img_buffer_end <= psVar54->img_buffer) goto LAB_00123763;
            }
            else {
              iVar13 = (*(psVar54->io).eof)(psVar54->io_user_data);
              if (iVar13 != 0) {
                if (psVar54->read_from_callbacks != 0) goto LAB_0012378c;
                goto LAB_00123763;
              }
            }
            psVar54 = psVar20->s;
            psVar38 = psVar54->img_buffer;
            if (psVar54->img_buffer_end <= psVar38) {
              if (psVar54->read_from_callbacks == 0) goto LAB_00123770;
              psVar38 = psVar54->buffer_start;
              iVar13 = (*(psVar54->io).read)(psVar54->io_user_data,(char *)psVar38,psVar54->buflen);
              if (iVar13 == 0) {
                psVar54->read_from_callbacks = 0;
                psVar54->img_buffer = psVar38;
                psVar54->img_buffer_end = psVar54->buffer_start + 1;
                psVar54->buffer_start[0] = '\0';
              }
              else {
                psVar54->img_buffer = psVar38;
                psVar54->img_buffer_end = psVar38 + iVar13;
              }
              psVar38 = psVar54->img_buffer;
            }
            psVar54->img_buffer = psVar38 + 1;
          } while (*psVar38 != 0xff);
          psVar54 = psVar20->s;
          psVar38 = psVar54->img_buffer;
          if (psVar38 < psVar54->img_buffer_end) {
LAB_0012388e:
            psVar54->img_buffer = psVar38 + 1;
            sVar10 = *psVar38;
          }
          else {
            if (psVar54->read_from_callbacks != 0) {
              psVar38 = psVar54->buffer_start;
              iVar13 = (*(psVar54->io).read)(psVar54->io_user_data,(char *)psVar38,psVar54->buflen);
              if (iVar13 == 0) {
                psVar54->read_from_callbacks = 0;
                psVar54->img_buffer = psVar38;
                psVar54->img_buffer_end = psVar54->buffer_start + 1;
                psVar54->buffer_start[0] = '\0';
              }
              else {
                psVar54->img_buffer = psVar38;
                psVar54->img_buffer_end = psVar38 + iVar13;
              }
              psVar38 = psVar54->img_buffer;
              goto LAB_0012388e;
            }
            sVar10 = '\0';
          }
          psVar20->marker = sVar10;
LAB_00123763:
          bVar11 = stbi__get_marker(psVar20);
        } while( true );
      }
LAB_00124a52:
      stbi__free_jpeg_components(psVar20,psVar20->s->img_n,uVar45);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_00124a61:
    pvVar23 = (void *)0x0;
LAB_00124a64:
    free(psVar20);
    return pvVar23;
  }
  iVar13 = stbi__check_png_header(s);
  psVar38 = s->img_buffer_original;
  s->img_buffer = psVar38;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar13 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    puVar22 = (uchar *)0x0;
    local_528 = (undefined1  [8])s;
    iVar13 = stbi__parse_png_file((stbi__png *)local_528,0,req_comp);
    uVar8 = data._16_8_;
    auVar32 = local_528;
    if (iVar13 != 0) {
      iVar13 = 8;
      if (8 < (int)data._24_4_) {
        iVar13 = data._24_4_;
      }
      ri->bits_per_channel = iVar13;
      data[8] = 0;
      data[9] = 0;
      data[10] = 0;
      data[0xb] = 0;
      puVar22 = (uchar *)uVar8;
      if ((req_comp != 0) && (iVar13 = *(int *)((long)local_528 + 0xc), iVar13 != req_comp)) {
        uVar45 = *(stbi__uint32 *)local_528;
        uVar15 = *(stbi__uint32 *)((long)local_528 + 4);
        if ((int)data._24_4_ < 9) {
          puVar22 = stbi__convert_format((uchar *)uVar8,iVar13,req_comp,uVar45,uVar15);
        }
        else {
          puVar22 = (uchar *)malloc((ulong)(req_comp * uVar45 * uVar15 * 2));
          if (puVar22 == (uchar *)0x0) {
            free((void *)uVar8);
            stbi__g_failure_reason = "outofmem";
            puVar22 = (uchar *)0x0;
          }
          else {
            if (0 < (int)uVar15) {
              uVar33 = req_comp + iVar13 * 8;
              if ((0x23 < uVar33) || ((0xe161a1c00U >> ((ulong)uVar33 & 0x3f) & 1) == 0)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                              ,0x682,
                              "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                             );
              }
              iVar47 = uVar45 - 1;
              uVar55 = 1;
              if (1 < (int)uVar15) {
                uVar55 = (ulong)uVar15;
              }
              uVar39 = 0;
              uVar42 = 0;
              uVar49 = 0;
              do {
                iVar43 = uVar45 * (int)uVar49;
                puVar52 = (ushort *)(uVar8 + (ulong)(uint)(iVar43 * iVar13) * 2);
                puVar28 = (ushort *)(puVar22 + (ulong)(uint)(iVar43 * req_comp) * 2);
                if (uVar33 - 10 < 0x19) {
                  lVar29 = uVar8 + uVar39 * 2;
                  lVar21 = uVar42 * 2;
                  switch(uVar33) {
                  case 10:
                    if (-1 < iVar47) {
                      lVar21 = 0;
                      uVar15 = uVar45;
                      do {
                        *(undefined2 *)(puVar22 + lVar21 * 2 + uVar42 * 2) =
                             *(undefined2 *)(lVar29 + lVar21);
                        (puVar22 + lVar21 * 2 + uVar42 * 2 + 2)[0] = 0xff;
                        (puVar22 + lVar21 * 2 + uVar42 * 2 + 2)[1] = 0xff;
                        uVar15 = uVar15 - 1;
                        lVar21 = lVar21 + 2;
                      } while (0 < (int)uVar15);
                    }
                    break;
                  case 0xb:
                    if (-1 < iVar47) {
                      puVar28 = (ushort *)(puVar22 + uVar42 * 2 + 4);
                      uVar15 = uVar45;
                      do {
                        uVar5 = *puVar52;
                        *puVar28 = uVar5;
                        puVar28[-1] = uVar5;
                        puVar28[-2] = uVar5;
                        puVar52 = puVar52 + 1;
                        uVar15 = uVar15 - 1;
                        puVar28 = puVar28 + 3;
                      } while (0 < (int)uVar15);
                    }
                    break;
                  case 0xc:
                    if (-1 < iVar47) {
                      lVar37 = 0;
                      uVar15 = uVar45;
                      do {
                        uVar6 = *(undefined2 *)(lVar29 + lVar37);
                        *(undefined2 *)(puVar22 + lVar37 * 4 + lVar21 + 4) = uVar6;
                        *(undefined2 *)(puVar22 + lVar37 * 4 + lVar21 + 2) = uVar6;
                        *(undefined2 *)(puVar22 + lVar37 * 4 + lVar21) = uVar6;
                        (puVar22 + lVar37 * 4 + lVar21 + 6)[0] = 0xff;
                        (puVar22 + lVar37 * 4 + lVar21 + 6)[1] = 0xff;
                        uVar15 = uVar15 - 1;
                        lVar37 = lVar37 + 2;
                      } while (0 < (int)uVar15);
                    }
                    break;
                  default:
                    goto switchD_00123b0c_caseD_d;
                  case 0x11:
                    if (-1 < iVar47) {
                      lVar21 = 0;
                      uVar15 = uVar45;
                      do {
                        *(undefined2 *)(puVar22 + lVar21 + uVar42 * 2) =
                             *(undefined2 *)(lVar29 + lVar21 * 2);
                        uVar15 = uVar15 - 1;
                        lVar21 = lVar21 + 2;
                      } while (0 < (int)uVar15);
                    }
                    break;
                  case 0x13:
                    if (-1 < iVar47) {
                      puVar28 = (ushort *)(puVar22 + uVar42 * 2 + 4);
                      uVar15 = uVar45;
                      do {
                        uVar5 = *puVar52;
                        *puVar28 = uVar5;
                        puVar28[-1] = uVar5;
                        puVar28[-2] = uVar5;
                        puVar52 = puVar52 + 2;
                        uVar15 = uVar15 - 1;
                        puVar28 = puVar28 + 3;
                      } while (0 < (int)uVar15);
                    }
                    break;
                  case 0x14:
                    if (-1 < iVar47) {
                      lVar37 = 0;
                      uVar15 = uVar45;
                      do {
                        uVar6 = *(undefined2 *)(lVar29 + lVar37);
                        *(undefined2 *)(puVar22 + lVar37 * 2 + lVar21 + 4) = uVar6;
                        *(undefined2 *)(puVar22 + lVar37 * 2 + lVar21 + 2) = uVar6;
                        *(undefined2 *)(puVar22 + lVar37 * 2 + lVar21) = uVar6;
                        *(undefined2 *)(puVar22 + lVar37 * 2 + lVar21 + 6) =
                             *(undefined2 *)(lVar29 + 2 + lVar37);
                        uVar15 = uVar15 - 1;
                        lVar37 = lVar37 + 4;
                      } while (0 < (int)uVar15);
                    }
                    break;
                  case 0x19:
                    uVar15 = uVar45;
                    if (-1 < iVar47) {
                      do {
                        uVar5 = puVar52[2];
                        *puVar28 = (ushort)((uint)uVar5 * 2 + ((uint)uVar5 + (uint)uVar5 * 8) * 3 +
                                            (uint)puVar52[1] * 0x96 + (uint)*puVar52 * 0x4d >> 8);
                        puVar52 = puVar52 + 3;
                        puVar28 = puVar28 + 1;
                        uVar15 = uVar15 - 1;
                      } while (0 < (int)uVar15);
                    }
                    break;
                  case 0x1a:
                    uVar15 = uVar45;
                    if (-1 < iVar47) {
                      do {
                        uVar5 = puVar52[2];
                        *puVar28 = (ushort)((uint)uVar5 * 2 + ((uint)uVar5 + (uint)uVar5 * 8) * 3 +
                                            (uint)puVar52[1] * 0x96 + (uint)*puVar52 * 0x4d >> 8);
                        puVar28[1] = 0xffff;
                        puVar52 = puVar52 + 3;
                        puVar28 = puVar28 + 2;
                        uVar15 = uVar15 - 1;
                      } while (0 < (int)uVar15);
                    }
                    break;
                  case 0x1c:
                    uVar15 = uVar45;
                    if (-1 < iVar47) {
                      do {
                        *puVar28 = *puVar52;
                        puVar28[1] = puVar52[1];
                        puVar28[2] = puVar52[2];
                        puVar28[3] = 0xffff;
                        puVar52 = puVar52 + 3;
                        puVar28 = puVar28 + 4;
                        uVar15 = uVar15 - 1;
                      } while (0 < (int)uVar15);
                    }
                    break;
                  case 0x21:
                    if (-1 < iVar47) {
                      lVar21 = 0;
                      uVar15 = uVar45;
                      do {
                        uVar5 = *(ushort *)(lVar29 + 4 + lVar21 * 4);
                        *(short *)(puVar22 + lVar21 + uVar42 * 2) =
                             (short)((uint)uVar5 * 2 + ((uint)uVar5 + (uint)uVar5 * 8) * 3 +
                                     (uint)*(ushort *)(lVar29 + 2 + lVar21 * 4) * 0x96 +
                                     (uint)*(ushort *)(lVar29 + lVar21 * 4) * 0x4d >> 8);
                        uVar15 = uVar15 - 1;
                        lVar21 = lVar21 + 2;
                      } while (0 < (int)uVar15);
                    }
                    break;
                  case 0x22:
                    if (-1 < iVar47) {
                      lVar21 = 0;
                      uVar15 = uVar45;
                      do {
                        uVar5 = *(ushort *)(lVar29 + 4 + lVar21 * 2);
                        *(short *)(puVar22 + lVar21 + uVar42 * 2) =
                             (short)((uint)uVar5 * 2 + ((uint)uVar5 + (uint)uVar5 * 8) * 3 +
                                     (uint)*(ushort *)(lVar29 + 2 + lVar21 * 2) * 0x96 +
                                     (uint)*(ushort *)(lVar29 + lVar21 * 2) * 0x4d >> 8);
                        *(undefined2 *)(puVar22 + lVar21 + uVar42 * 2 + 2) =
                             *(undefined2 *)(lVar29 + 6 + lVar21 * 2);
                        uVar15 = uVar15 - 1;
                        lVar21 = lVar21 + 4;
                      } while (0 < (int)uVar15);
                    }
                  }
                }
                else {
switchD_00123b0c_caseD_d:
                  uVar15 = uVar45;
                  if (-1 < iVar47) {
                    do {
                      *puVar28 = *puVar52;
                      puVar28[1] = puVar52[1];
                      puVar28[2] = puVar52[2];
                      puVar52 = puVar52 + 4;
                      puVar28 = puVar28 + 3;
                      uVar15 = uVar15 - 1;
                    } while (0 < (int)uVar15);
                  }
                }
                uVar49 = uVar49 + 1;
                uVar42 = (ulong)((int)uVar42 + req_comp * uVar45);
                uVar39 = (ulong)((int)uVar39 + iVar13 * uVar45);
              } while (uVar49 != uVar55);
            }
            free((void *)uVar8);
          }
        }
        *(int *)((long)auVar32 + 0xc) = req_comp;
        if (puVar22 == (uchar *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(stbi__uint32 *)local_528;
      *y = *(stbi__uint32 *)((long)local_528 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)((long)local_528 + 8);
      }
    }
    free((void *)data._16_8_);
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    free((void *)data._8_8_);
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    free((void *)data._0_8_);
    return puVar22;
  }
  if (s->img_buffer_original_end <= psVar38) {
    if (s->read_from_callbacks == 0) goto LAB_00123f67;
    psVar38 = s->buffer_start;
    iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
    if (iVar13 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar38;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar38;
      s->img_buffer_end = psVar38 + iVar13;
    }
    psVar38 = s->img_buffer;
  }
  s->img_buffer = psVar38 + 1;
  if (*psVar38 != 'B') {
LAB_00123f67:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    stbi__g_failure_reason = "unknown image type";
    return (void *)0x0;
  }
  psVar38 = s->img_buffer;
  if (s->img_buffer_end <= psVar38) {
    if (s->read_from_callbacks == 0) goto LAB_00123f67;
    psVar38 = s->buffer_start;
    iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
    if (iVar13 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar38;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar38;
      s->img_buffer_end = psVar38 + iVar13;
    }
    psVar38 = s->img_buffer;
  }
  s->img_buffer = psVar38 + 1;
  if (*psVar38 != 'M') goto LAB_00123f67;
  stbi__get16le(s);
  stbi__get16le(s);
  stbi__get16le(s);
  stbi__get16le(s);
  stbi__get16le(s);
  stbi__get16le(s);
  uVar45 = stbi__get16le(s);
  iVar13 = stbi__get16le(s);
  uVar45 = iVar13 << 0x10 | uVar45;
  if ((((0x38 < uVar45) || ((0x100010000001000U >> ((ulong)uVar45 & 0x3f) & 1) == 0)) &&
      (uVar45 != 0x7c)) && (uVar45 != 0x6c)) goto LAB_00123f67;
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  coutput[2] = (stbi_uc *)CONCAT44(0xff,(uint)coutput[2]);
  pvVar23 = stbi__bmp_parse_header(s,(stbi__bmp_data *)auStack_c8);
  if (pvVar23 == (void *)0x0) {
    return (void *)0x0;
  }
  sVar14 = s->img_y;
  sVar48 = -sVar14;
  if (0 < (int)sVar14) {
    sVar48 = sVar14;
  }
  s->img_y = sVar48;
  uVar45 = (uint)coutput[2];
  uVar9 = auStack_c8._0_4_;
  if ((int)coutput[0] == 0xc) {
    if ((int)auStack_c8._0_4_ < 0x18) {
      uVar15 = (auStack_c8._4_4_ + -0x26) / 3;
    }
    else {
LAB_00123fb3:
      uVar15 = 0;
    }
  }
  else {
    if (0xf < (int)auStack_c8._0_4_) goto LAB_00123fb3;
    uVar15 = (auStack_c8._4_4_ - (int)coutput[0]) + -0xe >> 2;
  }
  local_48 = coutput[2]._4_4_;
  uVar33 = (uint)coutput[2] ^ 0xff000000;
  s->img_n = 4 - (uint)((uint)coutput[2] == 0 || auStack_c8._0_4_ == 0x18 && uVar33 == 0);
  iVar13 = req_comp;
  if (req_comp < 3) {
    iVar13 = s->img_n;
  }
  sVar46 = s->img_x;
  iVar47 = stbi__mad3sizes_valid(iVar13,sVar46,sVar48,0);
  if (iVar47 == 0) {
    stbi__g_failure_reason = "too large";
    return (void *)0x0;
  }
  puVar22 = (uchar *)stbi__malloc_mad3(iVar13,sVar46,sVar48,0);
  if (puVar22 == (uchar *)0x0) {
    stbi__g_failure_reason = "outofmem";
    return (void *)0x0;
  }
  if ((int)uVar9 < 0x10) {
    if (0x100 < (int)uVar15 || uVar15 == 0) {
      free(puVar22);
      stbi__g_failure_reason = "invalid";
      return (void *)0x0;
    }
    if (0 < (int)uVar15) {
      psVar38 = s->buffer_start;
      psVar1 = s->buffer_start + 1;
      uVar55 = 0;
      do {
        psVar25 = s->img_buffer;
        if (psVar25 < s->img_buffer_end) {
LAB_00124c18:
          s->img_buffer = psVar25 + 1;
          sVar10 = *psVar25;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar47 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
            if (iVar47 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar38;
              s->img_buffer_end = psVar1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar38;
              s->img_buffer_end = psVar38 + iVar47;
            }
            psVar25 = s->img_buffer;
            goto LAB_00124c18;
          }
          sVar10 = '\0';
        }
        *(stbi_uc *)(data + uVar55 * 2 + -3) = sVar10;
        psVar25 = s->img_buffer;
        if (psVar25 < s->img_buffer_end) {
LAB_00124c9a:
          s->img_buffer = psVar25 + 1;
          sVar10 = *psVar25;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar47 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
            if (iVar47 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar38;
              s->img_buffer_end = psVar1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar38;
              s->img_buffer_end = psVar38 + iVar47;
            }
            psVar25 = s->img_buffer;
            goto LAB_00124c9a;
          }
          sVar10 = '\0';
        }
        *(stbi_uc *)((long)data + uVar55 * 4 + -7) = sVar10;
        psVar25 = s->img_buffer;
        if (psVar25 < s->img_buffer_end) {
LAB_00124d1c:
          s->img_buffer = psVar25 + 1;
          sVar10 = *psVar25;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar47 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
            if (iVar47 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar38;
              s->img_buffer_end = psVar1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar38;
              s->img_buffer_end = psVar38 + iVar47;
            }
            psVar25 = s->img_buffer;
            goto LAB_00124d1c;
          }
          sVar10 = '\0';
        }
        *(stbi_uc *)(data + uVar55 * 2 + -4) = sVar10;
        if ((int)coutput[0] != 0xc) {
          psVar25 = s->img_buffer;
          if (s->img_buffer_end <= psVar25) {
            if (s->read_from_callbacks == 0) goto LAB_00124daa;
            iVar47 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
            if (iVar47 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar38;
              s->img_buffer_end = psVar1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar38;
              s->img_buffer_end = psVar38 + iVar47;
            }
            psVar25 = s->img_buffer;
          }
          s->img_buffer = psVar25 + 1;
        }
LAB_00124daa:
        *(undefined1 *)((long)data + uVar55 * 4 + -5) = 0xff;
        uVar55 = uVar55 + 1;
      } while (uVar15 != uVar55);
    }
    stbi__skip(s,auStack_c8._4_4_ +
                 (uVar15 * ((int)coutput[0] == 0xc | 0xfffffffc) - (int)coutput[0]) + -0xe);
    if (uVar9 == 8) {
      sVar48 = s->img_x;
    }
    else if (uVar9 == 4) {
      sVar48 = s->img_x + 1 >> 1;
    }
    else {
      if (uVar9 != 1) {
        free(puVar22);
        stbi__g_failure_reason = "bad bpp";
        return (void *)0x0;
      }
      sVar48 = s->img_x + 7 >> 3;
    }
    local_88 = -sVar48 & 3;
    if (uVar9 == 1) {
      if (0 < (int)s->img_y) {
        psVar38 = s->buffer_start;
        iVar43 = 0;
        iVar47 = 0;
        do {
          pbVar35 = s->img_buffer;
          if (pbVar35 < s->img_buffer_end) {
LAB_00125547:
            s->img_buffer = pbVar35 + 1;
            uVar45 = (uint)*pbVar35;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar18 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
              if (iVar18 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar38;
                s->img_buffer_end = s->buffer_start + 1;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar38;
                s->img_buffer_end = psVar38 + iVar18;
              }
              pbVar35 = s->img_buffer;
              goto LAB_00125547;
            }
            uVar45 = 0;
          }
          uVar15 = 7;
          sVar46 = 1;
          do {
            sVar7 = s->img_x;
            if ((int)sVar7 <= (int)(sVar46 - 1)) break;
            uVar39 = (ulong)((uVar45 >> (uVar15 & 0x1f) & 1) != 0);
            lVar21 = (long)iVar43;
            uVar55 = lVar21 + 3;
            puVar22[lVar21] = (uchar)data[uVar39 * 2 + -4];
            puVar22[lVar21 + 1] = *(uchar *)((long)data + uVar39 * 4 + -7);
            puVar22[lVar21 + 2] = (uchar)data[uVar39 * 2 + -3];
            if (iVar13 == 4) {
              puVar22[uVar55] = 0xff;
              uVar55 = (ulong)(iVar43 + 4);
            }
            iVar43 = (int)uVar55;
            if (sVar46 != sVar7) {
              if ((int)uVar15 < 1) {
                pbVar35 = s->img_buffer;
                if (pbVar35 < s->img_buffer_end) {
LAB_0012564e:
                  s->img_buffer = pbVar35 + 1;
                  uVar45 = (uint)*pbVar35;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar18 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
                    if (iVar18 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar38;
                      s->img_buffer_end = s->buffer_start + 1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar38;
                      s->img_buffer_end = psVar38 + iVar18;
                    }
                    pbVar35 = s->img_buffer;
                    goto LAB_0012564e;
                  }
                  uVar45 = 0;
                }
                uVar15 = 7;
              }
              else {
                uVar15 = uVar15 - 1;
              }
            }
            bVar57 = sVar46 != sVar7;
            sVar46 = sVar46 + 1;
          } while (bVar57);
          stbi__skip(s,-sVar48 & 3);
          iVar47 = iVar47 + 1;
        } while (iVar47 < (int)s->img_y);
      }
    }
    else if (0 < (int)s->img_y) {
      psVar38 = s->buffer_start;
      uVar55 = 0;
      iVar47 = 0;
      do {
        if (0 < (int)s->img_x) {
          iVar43 = 0;
          do {
            pbVar35 = s->img_buffer;
            if (pbVar35 < s->img_buffer_end) {
LAB_00125755:
              s->img_buffer = pbVar35 + 1;
              uVar45 = (uint)*pbVar35;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar18 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
                if (iVar18 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar38;
                  s->img_buffer_end = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar38;
                  s->img_buffer_end = psVar38 + iVar18;
                }
                pbVar35 = s->img_buffer;
                goto LAB_00125755;
              }
              uVar45 = 0;
            }
            uVar15 = uVar45 >> 4;
            if (uVar9 != 4) {
              uVar15 = uVar45;
            }
            uVar39 = (ulong)uVar15;
            uVar45 = uVar45 & 0xf;
            if (uVar9 != 4) {
              uVar45 = 0;
            }
            lVar21 = (long)(int)uVar55;
            uVar42 = lVar21 + 3;
            puVar22[lVar21] = (uchar)data[uVar39 * 2 + -4];
            puVar22[lVar21 + 1] = *(uchar *)((long)data + uVar39 * 4 + -7);
            puVar22[lVar21 + 2] = (uchar)data[uVar39 * 2 + -3];
            if (iVar13 == 4) {
              puVar22[uVar42] = 0xff;
              uVar42 = (ulong)((int)uVar55 + 4);
            }
            uVar15 = (uint)uVar42;
            sVar48 = s->img_x;
            if (iVar43 + 1U == sVar48) {
LAB_00125899:
              uVar55 = (ulong)uVar15;
            }
            else {
              if (uVar9 == 8) {
                pbVar35 = s->img_buffer;
                if (s->img_buffer_end <= pbVar35) {
                  if (s->read_from_callbacks == 0) {
                    uVar45 = 0;
                    goto LAB_0012585f;
                  }
                  iVar18 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
                  if (iVar18 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar38;
                    s->img_buffer_end = s->buffer_start + 1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar38;
                    s->img_buffer_end = psVar38 + iVar18;
                  }
                  pbVar35 = s->img_buffer;
                }
                s->img_buffer = pbVar35 + 1;
                uVar45 = (uint)*pbVar35;
              }
LAB_0012585f:
              lVar21 = (long)(int)uVar15;
              uVar55 = lVar21 + 3;
              uVar39 = (ulong)uVar45;
              puVar22[lVar21] = (uchar)data[uVar39 * 2 + -4];
              puVar22[lVar21 + 1] = *(uchar *)((long)data + uVar39 * 4 + -7);
              puVar22[lVar21 + 2] = (uchar)data[uVar39 * 2 + -3];
              if (iVar13 == 4) {
                uVar15 = uVar15 + 4;
                puVar22[uVar55] = 0xff;
                goto LAB_00125899;
              }
            }
          } while ((iVar43 + 1U != sVar48) && (iVar43 = iVar43 + 2, iVar43 < (int)s->img_x));
        }
        stbi__skip(s,local_88);
        iVar47 = iVar47 + 1;
      } while (iVar47 < (int)s->img_y);
    }
    goto LAB_001258df;
  }
  stbi__skip(s,(auStack_c8._4_4_ - (int)coutput[0]) + -0xe);
  if (uVar9 == 0x18) {
    iVar47 = -3;
LAB_00124e2d:
    uVar15 = iVar47 * s->img_x & 3;
  }
  else {
    uVar15 = 0;
    if (uVar9 == 0x10) {
      iVar47 = -2;
      goto LAB_00124e2d;
    }
  }
  iVar47 = 0;
  if (uVar9 == 0x18) {
    bVar57 = false;
LAB_00124e7a:
    bVar56 = false;
  }
  else {
    if (uVar9 != 0x20) {
      bVar57 = true;
      goto LAB_00124e7a;
    }
    bVar56 = (coutput[0]._4_4_ == 0xff0000 &&
             ((uint)coutput[1] == 0xff00 && coutput[1]._4_4_ == 0xff)) && uVar33 == 0;
    bVar57 = (coutput[0]._4_4_ != 0xff0000 ||
             ((uint)coutput[1] != 0xff00 || coutput[1]._4_4_ != 0xff)) || uVar33 != 0;
  }
  coutput[3] = (stbi_uc *)((ulong)coutput[3] & 0xffffffff00000000);
  local_9c = 0;
  iVar43 = 0;
  uVar33 = 0;
  uVar44 = 0;
  uVar16 = 0;
  local_cc = 0;
  if (bVar57) {
    if (((uint)coutput[1] != 0 && coutput[0]._4_4_ != 0) && coutput[1]._4_4_ != 0) {
      iVar47 = stbi__high_bit(coutput[0]._4_4_);
      iVar47 = iVar47 + -7;
      uVar33 = (coutput[0]._4_4_ >> 1 & 0x55555555) + (coutput[0]._4_4_ & 0x55555555);
      uVar33 = (uVar33 >> 2 & 0x33333333) + (uVar33 & 0x33333333);
      uVar33 = (uVar33 >> 4) + uVar33 & 0xf0f0f0f;
      uVar33 = (uVar33 >> 8) + uVar33;
      uVar33 = (uVar33 >> 0x10) + uVar33 & 0xff;
      iVar43 = stbi__high_bit((uint)coutput[1]);
      coutput[3] = (stbi_uc *)CONCAT44(coutput[3]._4_4_,iVar43 + -7);
      uVar44 = ((uint)coutput[1] >> 1 & 0x55555555) + ((uint)coutput[1] & 0x55555555);
      uVar44 = (uVar44 >> 2 & 0x33333333) + (uVar44 & 0x33333333);
      uVar44 = (uVar44 >> 4) + uVar44 & 0xf0f0f0f;
      uVar44 = (uVar44 >> 8) + uVar44;
      uVar44 = (uVar44 >> 0x10) + uVar44 & 0xff;
      local_9c = stbi__high_bit(coutput[1]._4_4_);
      local_9c = local_9c + -7;
      uVar16 = (coutput[1]._4_4_ >> 1 & 0x55555555) + (coutput[1]._4_4_ & 0x55555555);
      uVar16 = (uVar16 >> 2 & 0x33333333) + (uVar16 & 0x33333333);
      uVar16 = (uVar16 >> 4) + uVar16 & 0xf0f0f0f;
      uVar16 = (uVar16 >> 8) + uVar16;
      uVar16 = (uVar16 >> 0x10) + uVar16 & 0xff;
      iVar43 = stbi__high_bit(uVar45);
      iVar43 = iVar43 + -7;
      uVar30 = (uVar45 >> 1 & 0x55555555) + (uVar45 & 0x55555555);
      uVar30 = (uVar30 >> 2 & 0x33333333) + (uVar30 & 0x33333333);
      uVar30 = (uVar30 >> 4) + uVar30 & 0xf0f0f0f;
      uVar30 = (uVar30 >> 8) + uVar30;
      local_cc = (uVar30 >> 0x10) + uVar30 & 0xff;
      goto LAB_00125074;
    }
    free(puVar22);
    stbi__g_failure_reason = "bad masks";
    bVar27 = false;
  }
  else {
LAB_00125074:
    bVar27 = true;
    if (0 < (int)s->img_y) {
      psVar38 = s->buffer_start;
      psVar1 = s->buffer_start + 1;
      iVar40 = 0;
      iVar18 = 0;
      do {
        if (bVar57) {
          if (0 < (int)s->img_x) {
            iVar41 = 0;
            do {
              uVar30 = stbi__get16le(s);
              if (uVar9 != 0x10) {
                iVar19 = stbi__get16le(s);
                uVar30 = uVar30 | iVar19 << 0x10;
              }
              iVar19 = stbi__shiftsigned(uVar30 & coutput[0]._4_4_,iVar47,uVar33);
              lVar21 = (long)iVar40;
              puVar22[lVar21] = (uchar)iVar19;
              iVar19 = stbi__shiftsigned(uVar30 & (uint)coutput[1],(int)coutput[3],uVar44);
              puVar22[lVar21 + 1] = (uchar)iVar19;
              iVar19 = stbi__shiftsigned(uVar30 & coutput[1]._4_4_,local_9c,uVar16);
              puVar22[lVar21 + 2] = (uchar)iVar19;
              if (uVar45 == 0) {
                uVar30 = 0xff;
              }
              else {
                uVar30 = stbi__shiftsigned(uVar30 & uVar45,iVar43,local_cc);
              }
              uVar55 = lVar21 + 3;
              if (iVar13 == 4) {
                puVar22[uVar55] = (uchar)uVar30;
                uVar55 = (ulong)(iVar40 + 4);
              }
              local_48 = local_48 | uVar30;
              iVar41 = iVar41 + 1;
              iVar40 = (int)uVar55;
            } while (iVar41 < (int)s->img_x);
          }
        }
        else if (0 < (int)s->img_x) {
          iVar41 = 0;
          do {
            puVar26 = s->img_buffer;
            if (puVar26 < s->img_buffer_end) {
LAB_00125212:
              s->img_buffer = puVar26 + 1;
              uVar12 = *puVar26;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
                if (iVar19 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar38;
                  s->img_buffer_end = psVar1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar38;
                  s->img_buffer_end = psVar38 + iVar19;
                }
                puVar26 = s->img_buffer;
                goto LAB_00125212;
              }
              uVar12 = '\0';
            }
            lVar21 = (long)iVar40;
            puVar22[lVar21 + 2] = uVar12;
            puVar26 = s->img_buffer;
            if (puVar26 < s->img_buffer_end) {
LAB_001252a4:
              s->img_buffer = puVar26 + 1;
              uVar12 = *puVar26;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
                if (iVar19 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar38;
                  s->img_buffer_end = psVar1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar38;
                  s->img_buffer_end = psVar38 + iVar19;
                }
                puVar26 = s->img_buffer;
                goto LAB_001252a4;
              }
              uVar12 = '\0';
            }
            puVar22[lVar21 + 1] = uVar12;
            puVar26 = s->img_buffer;
            if (puVar26 < s->img_buffer_end) {
LAB_00125333:
              s->img_buffer = puVar26 + 1;
              uVar12 = *puVar26;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
                if (iVar19 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar38;
                  s->img_buffer_end = psVar1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar38;
                  s->img_buffer_end = psVar38 + iVar19;
                }
                puVar26 = s->img_buffer;
                goto LAB_00125333;
              }
              uVar12 = '\0';
            }
            puVar22[lVar21] = uVar12;
            bVar11 = 0xff;
            if (bVar56) {
              pbVar35 = s->img_buffer;
              if (s->img_buffer_end <= pbVar35) {
                if (s->read_from_callbacks == 0) {
                  bVar11 = 0;
                  goto LAB_001253dd;
                }
                iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar38,s->buflen);
                if (iVar19 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar38;
                  s->img_buffer_end = psVar1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar38;
                  s->img_buffer_end = psVar38 + iVar19;
                }
                pbVar35 = s->img_buffer;
              }
              s->img_buffer = pbVar35 + 1;
              bVar11 = *pbVar35;
            }
LAB_001253dd:
            uVar55 = lVar21 + 3;
            if (iVar13 == 4) {
              puVar22[uVar55] = bVar11;
              uVar55 = (ulong)(iVar40 + 4);
            }
            local_48 = local_48 | bVar11;
            iVar41 = iVar41 + 1;
            iVar40 = (int)uVar55;
          } while (iVar41 < (int)s->img_x);
        }
        stbi__skip(s,uVar15);
        iVar18 = iVar18 + 1;
      } while (iVar18 < (int)s->img_y);
      bVar27 = true;
    }
  }
  if (!bVar27) {
    return (void *)0x0;
  }
LAB_001258df:
  if (((iVar13 == 4) && (local_48 == 0)) && (iVar47 = s->img_x * s->img_y * 4, -1 < iVar47 + -1)) {
    lVar21 = (ulong)(iVar47 - 4) + 7;
    do {
      puVar22[lVar21 + -4] = 0xff;
      lVar21 = lVar21 + -4;
    } while (3 < lVar21);
  }
  if (0 < (int)sVar14) {
    uVar45 = (int)s->img_y >> 1;
    if (0 < (int)uVar45) {
      uVar33 = s->img_x * iVar13;
      uVar15 = (s->img_y - 1) * uVar33;
      uVar55 = 0;
      uVar39 = 0;
      do {
        if (0 < (int)uVar33) {
          uVar42 = 0;
          do {
            uVar12 = puVar22[uVar42 + uVar55];
            puVar22[uVar42 + uVar55] = puVar22[uVar42 + uVar15];
            puVar22[uVar42 + uVar15] = uVar12;
            uVar42 = uVar42 + 1;
          } while (uVar33 != uVar42);
        }
        uVar39 = uVar39 + 1;
        uVar15 = uVar15 - uVar33;
        uVar55 = (ulong)((int)uVar55 + uVar33);
      } while (uVar39 != uVar45);
    }
  }
  if ((iVar13 != req_comp && req_comp != 0) &&
     (puVar22 = stbi__convert_format(puVar22,iVar13,req_comp,s->img_x,s->img_y),
     puVar22 == (uchar *)0x0)) {
    return (void *)0x0;
  }
  *x = s->img_x;
  *y = s->img_y;
  if (comp != (int *)0x0) {
    *comp = s->img_n;
    return puVar22;
  }
  return puVar22;
LAB_001233ed:
  iVar18 = iVar18 + 1;
  bVar57 = iVar18 < paVar2[iVar13].v;
  if (paVar2[iVar13].v <= iVar18) goto LAB_00123405;
  goto LAB_0012338f;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}